

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O0

CornerIndex __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder>::GetRightCorner
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalValenceEncoder> *this,
          CornerIndex corner_id)

{
  CornerIndex CVar1;
  undefined4 in_ESI;
  CornerTable *in_RDI;
  CornerIndex next_corner_id;
  CornerIndex in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffec;
  CornerTable *pCVar2;
  
  pCVar2 = in_RDI;
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x1a365f);
  CornerTable::Next((CornerTable *)CONCAT44(in_stack_ffffffffffffffec,in_ESI),
                    (CornerIndex)(uint)pCVar2);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::operator->
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)0x1a3684);
  CVar1 = CornerTable::Opposite(in_RDI,in_stack_ffffffffffffffe0);
  return (CornerIndex)CVar1.value_;
}

Assistant:

CornerIndex MeshEdgebreakerEncoderImpl<TraversalEncoder>::GetRightCorner(
    CornerIndex corner_id) const {
  const CornerIndex next_corner_id = corner_table_->Next(corner_id);
  return corner_table_->Opposite(next_corner_id);
}